

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

ArrayWithPreallocation<soul::Identifier,_8UL> * __thiscall
soul::ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
          (ArrayWithPreallocation<soul::Identifier,_8UL> *this,
          ArrayWithPreallocation<soul::Identifier,_8UL> *other)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  
  this->numActive = 0;
  if (8 < this->numAllocated) {
    if (this->items != (Identifier *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (Identifier *)this->space;
    this->numAllocated = 8;
  }
  uVar1 = other->numAllocated;
  if (uVar1 < 9) {
    sVar2 = other->numActive;
    this->numActive = sVar2;
    if (sVar2 != 0) {
      sVar3 = 0;
      do {
        this->items[sVar3].name = other->items[sVar3].name;
        sVar3 = sVar3 + 1;
      } while (sVar2 != sVar3);
    }
  }
  else {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar1;
    other->items = (Identifier *)other->space;
    other->numAllocated = 8;
    other->numActive = 0;
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (ArrayWithPreallocation&& other) noexcept
    {
        clear();

        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }

        return *this;
    }